

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrCompositionLayerBaseHeader *value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_300;
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [8];
  string error_str_5;
  XrCompositionLayerPassthroughHTC *new_value_7;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [8];
  string error_str_4;
  XrCompositionLayerPassthroughFB *new_value_6;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [8];
  string error_str_3;
  XrCompositionLayerEquirect2KHR *new_value_5;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [8];
  string error_str_2;
  XrCompositionLayerEquirectKHR *new_value_4;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [8];
  string error_str_1;
  XrCompositionLayerCylinderKHR *new_value_3;
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [8];
  string error_str;
  XrCompositionLayerCubeKHR *new_value_2;
  XrCompositionLayerQuad *new_value_1;
  XrCompositionLayerProjection *new_value;
  XrResult xr_result;
  XrCompositionLayerBaseHeader *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerProjection *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerQuad *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_KHR_composition_layer_cube")
       , !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,"XrCompositionLayerBaseHeader being used with child struct type ",
                 &local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::__cxx11::string::operator+=(local_78,"\"XR_TYPE_COMPOSITION_LAYER_CUBE_KHR\"");
      std::__cxx11::string::operator+=
                (local_78,
                 " which requires extension \"XR_KHR_composition_layer_cube\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"VUID-XrCompositionLayerBaseHeader-type-type",&local_b1)
      ;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_3,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_value_3,(string *)local_78);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_3);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::~string(local_78);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerCubeKHR *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                 "XR_KHR_composition_layer_cylinder"), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_f8,"XrCompositionLayerBaseHeader being used with child struct type ",
                 &local_f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::operator+=(local_f8,"\"XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR\"");
      std::__cxx11::string::operator+=
                (local_f8,
                 " which requires extension \"XR_KHR_composition_layer_cylinder\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_120,"VUID-XrCompositionLayerBaseHeader-type-type",&local_121);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_4,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_120,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_value_4,(string *)local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_4);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      std::__cxx11::string::~string(local_f8);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerCylinderKHR *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                 "XR_KHR_composition_layer_equirect"), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_168,"XrCompositionLayerBaseHeader being used with child struct type ",
                 &local_169);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::operator+=(local_168,"\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR\"");
      std::__cxx11::string::operator+=
                (local_168,
                 " which requires extension \"XR_KHR_composition_layer_equirect\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_190,"VUID-XrCompositionLayerBaseHeader-type-type",&local_191);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_5,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_value_5,(string *)local_168);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_5);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      std::__cxx11::string::~string(local_168);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerEquirectKHR *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                 "XR_KHR_composition_layer_equirect2"), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"XrCompositionLayerBaseHeader being used with child struct type ",
                 &local_1d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::__cxx11::string::operator+=(local_1d8,"\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR\"");
      std::__cxx11::string::operator+=
                (local_1d8,
                 " which requires extension \"XR_KHR_composition_layer_equirect2\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_200,"VUID-XrCompositionLayerBaseHeader-type-type",&local_201);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_6,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_200,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_value_6,(string *)local_1d8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_6);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::__cxx11::string::~string(local_1d8);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerEquirect2KHR *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_FB_passthrough"), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_248,"XrCompositionLayerBaseHeader being used with child struct type ",
                 &local_249);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      std::__cxx11::string::operator+=(local_248,"\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB\"");
      std::__cxx11::string::operator+=
                (local_248,
                 " which requires extension \"XR_FB_passthrough\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_270,"VUID-XrCompositionLayerBaseHeader-type-type",&local_271);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_7,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_270,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&new_value_7,(string *)local_248);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &new_value_7);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::__cxx11::string::~string(local_248);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerPassthroughFB *)value);
  }
  else if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_HTC_passthrough"), !bVar1))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2b8,"XrCompositionLayerBaseHeader being used with child struct type ",
                 &local_2b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      std::__cxx11::string::operator+=(local_2b8,"\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC\"");
      std::__cxx11::string::operator+=
                (local_2b8,
                 " which requires extension \"XR_HTC_passthrough\" to be enabled, but it is not enabled"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e0,"VUID-XrCompositionLayerBaseHeader-type-type",&local_2e1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_300,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_2e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_300,(string *)local_2b8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_300);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      std::__cxx11::string::~string(local_2b8);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    instance_info_local._4_4_ =
         ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                          (XrCompositionLayerPassthroughHTC *)value);
  }
  else {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrCompositionLayerBaseHeader",value->type,
               "VUID-XrCompositionLayerBaseHeader-type-type",XR_TYPE_UNKNOWN,"");
    instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrCompositionLayerBaseHeader* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-next-next" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-layerFlags-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrCompositionLayerBaseHeader-space-parameter" because it is a base structure
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
        const XrCompositionLayerProjection* new_value = reinterpret_cast<const XrCompositionLayerProjection*>(value);
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
        const XrCompositionLayerQuad* new_value = reinterpret_cast<const XrCompositionLayerQuad*>(value);
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
        const XrCompositionLayerCubeKHR* new_value = reinterpret_cast<const XrCompositionLayerCubeKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_cube")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_CUBE_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_cube\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
        const XrCompositionLayerCylinderKHR* new_value = reinterpret_cast<const XrCompositionLayerCylinderKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_cylinder")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_cylinder\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
        const XrCompositionLayerEquirectKHR* new_value = reinterpret_cast<const XrCompositionLayerEquirectKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_equirect")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_equirect\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
        const XrCompositionLayerEquirect2KHR* new_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_composition_layer_equirect2")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR\"";
            error_str += " which requires extension \"XR_KHR_composition_layer_equirect2\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
        const XrCompositionLayerPassthroughFB* new_value = reinterpret_cast<const XrCompositionLayerPassthroughFB*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_passthrough")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB\"";
            error_str += " which requires extension \"XR_FB_passthrough\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
        const XrCompositionLayerPassthroughHTC* new_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_HTC_passthrough")) {
            std::string error_str = "XrCompositionLayerBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC\"";
            error_str += " which requires extension \"XR_HTC_passthrough\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrCompositionLayerBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrCompositionLayerBaseHeader",
                         value->type, "VUID-XrCompositionLayerBaseHeader-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}